

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyfiledialogs.c
# Opt level: O0

int graphicMode(void)

{
  int iVar1;
  char *pcVar2;
  bool local_c;
  bool local_b;
  bool local_a;
  bool local_9;
  
  if (tinyfd_forceConsole != 0) {
    iVar1 = isTerminalRunning();
    local_9 = false;
    if (iVar1 != 0) goto LAB_00121796;
    pcVar2 = terminalName();
    local_9 = false;
    if (pcVar2 != (char *)0x0) goto LAB_00121796;
  }
  pcVar2 = getenv("DISPLAY");
  local_a = true;
  if (pcVar2 == (char *)0x0) {
    iVar1 = isDarwin();
    local_b = false;
    if (iVar1 != 0) {
      pcVar2 = getenv("SSH_TTY");
      local_c = true;
      if (pcVar2 != (char *)0x0) {
        pcVar2 = getenv("DISPLAY");
        local_c = pcVar2 != (char *)0x0;
      }
      local_b = local_c;
    }
    local_a = local_b;
  }
  local_9 = local_a;
LAB_00121796:
  return (int)local_9;
}

Assistant:

static int graphicMode( )
{
        return !( tinyfd_forceConsole && (isTerminalRunning() || terminalName()) )
          && ( getenv("DISPLAY")
            || (isDarwin() && (!getenv("SSH_TTY") || getenv("DISPLAY") ) ) ) ;
}